

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O0

QString * __thiscall QWidgetLineControl::surroundingText(QWidgetLineControl *this)

{
  long lVar1;
  bool bVar2;
  QByteArrayView *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString *in_stack_ffffffffffffffb8;
  QString *data;
  undefined8 local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data = in_RDI;
  bVar2 = QString::isNull((QString *)0x5ccf00);
  if (bVar2) {
    QByteArrayView::QByteArrayView<1ul>(in_RSI,(char (*) [1])data);
    QVar3.m_data = local_18;
    QVar3.m_size = (qsizetype)in_RDI;
    QString::fromLatin1(QVar3);
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

QString surroundingText() const
    {
        return m_text.isNull() ? QString::fromLatin1("") : m_text;
    }